

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

void __thiscall Arena::free(Arena *this,void *__ptr)

{
  ChunkToSizeMap *this_00;
  ChunkToSizeMap *this_01;
  long lVar1;
  iterator __it;
  iterator iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  runtime_error *this_02;
  unsigned_long uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  pair<char_*,_unsigned_long> freed;
  char *local_58;
  char *local_50;
  unsigned_long local_48;
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = __ptr;
  if (__ptr != (void *)0x0) {
    __it = std::
           _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->chunks_used)._M_h,&local_40);
    if (__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur ==
        (__node_type *)0x0) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Arena: invalid or double free");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_001747f5;
    }
    pcVar6 = *(char **)((long)__it.
                              super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>
                              ._M_cur + 8);
    uVar5 = *(unsigned_long *)
             ((long)__it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>.
                    _M_cur + 0x10);
    local_50 = pcVar6;
    local_48 = uVar5;
    std::
    _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->chunks_used)._M_h,
            (const_iterator)
            __it.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur);
    this_00 = &this->chunks_free_end;
    local_58 = pcVar6;
    iVar2 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_58);
    if (iVar2.
        super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      lVar1 = *(long *)(*(_Base_ptr *)
                         ((long)iVar2.
                                super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                                ._M_cur + 0x10) + 1);
      pcVar6 = pcVar6 + -lVar1;
      uVar5 = uVar5 + lVar1;
      local_50 = pcVar6;
      local_48 = uVar5;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                          *)&this->size_to_free_chunk,
                         *(_Base_ptr *)
                          ((long)iVar2.
                                 super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                                 ._M_cur + 0x10));
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&this_00->_M_h,
              (const_iterator)
              iVar2.
              super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
              ._M_cur);
    }
    this_01 = &this->chunks_free;
    local_58 = pcVar6 + uVar5;
    iVar2 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&local_58);
    if (iVar2.
        super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_48 = uVar5 + *(long *)(*(_Base_ptr *)
                                    ((long)iVar2.
                                           super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                                           ._M_cur + 0x10) + 1);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                          *)&this->size_to_free_chunk,
                         *(_Base_ptr *)
                          ((long)iVar2.
                                 super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
                                 ._M_cur + 0x10));
      std::
      _Hashtable<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&this_01->_M_h,
              (const_iterator)
              iVar2.
              super__Node_iterator_base<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_false>
              ._M_cur);
    }
    iVar3 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
            ::_M_emplace_equal<unsigned_long&,char*&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,void*>,std::_Select1st<std::pair<unsigned_long_const,void*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,void*>>>
                        *)&this->size_to_free_chunk,&local_48,&local_50);
    local_58 = local_50;
    pmVar4 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_01,&local_58);
    pmVar4->_M_node = iVar3._M_node;
    local_58 = local_50 + local_48;
    pmVar4 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>,_std::allocator<std::pair<void_*const,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_void_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_58);
    pmVar4->_M_node = iVar3._M_node;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001747f5:
  __stack_chk_fail();
}

Assistant:

void Arena::free(void *ptr)
{
    // Freeing the nullptr pointer is OK.
    if (ptr == nullptr) {
        return;
    }

    // Remove chunk from used map
    auto i = chunks_used.find(ptr);
    if (i == chunks_used.end()) {
        throw std::runtime_error("Arena: invalid or double free");
    }
    auto freed = std::make_pair(static_cast<char*>(i->first), i->second);
    chunks_used.erase(i);

    // coalesce freed with previous chunk
    auto prev = chunks_free_end.find(freed.first);
    if (prev != chunks_free_end.end()) {
        freed.first -= prev->second->first;
        freed.second += prev->second->first;
        size_to_free_chunk.erase(prev->second);
        chunks_free_end.erase(prev);
    }

    // coalesce freed with chunk after freed
    auto next = chunks_free.find(freed.first + freed.second);
    if (next != chunks_free.end()) {
        freed.second += next->second->first;
        size_to_free_chunk.erase(next->second);
        chunks_free.erase(next);
    }

    // Add/set space with coalesced free chunk
    auto it = size_to_free_chunk.emplace(freed.second, freed.first);
    chunks_free[freed.first] = it;
    chunks_free_end[freed.first + freed.second] = it;
}